

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void setup_loop_pressure(gen_ctx_t gen_ctx,loop_node_t_conflict loop_node)

{
  int iVar1;
  gen_ctx_t gen_ctx_00;
  long lVar2;
  
  for (gen_ctx_00 = (gen_ctx_t)gen_ctx->to_free; gen_ctx_00 != (gen_ctx_t)0x0;
      gen_ctx_00 = (gen_ctx_t)gen_ctx_00->addr_regs) {
    lVar2 = *(long *)&gen_ctx_00->optimize_level;
    if (lVar2 == 0) {
      setup_loop_pressure(gen_ctx_00,loop_node);
    }
    else {
      *(undefined4 *)&gen_ctx_00->insn_to_consider = *(undefined4 *)(lVar2 + 0xa0);
      *(undefined4 *)((long)&gen_ctx_00->insn_to_consider + 4) = *(undefined4 *)(lVar2 + 0xa4);
    }
    if (*(int *)&gen_ctx->insn_to_consider < *(int *)&gen_ctx_00->insn_to_consider) {
      *(int *)&gen_ctx->insn_to_consider = *(int *)&gen_ctx_00->insn_to_consider;
    }
    iVar1 = *(int *)((long)&gen_ctx_00->insn_to_consider + 4);
    if (*(int *)((long)&gen_ctx->insn_to_consider + 4) < iVar1) {
      *(int *)((long)&gen_ctx->insn_to_consider + 4) = iVar1;
    }
  }
  return;
}

Assistant:

static void setup_loop_pressure (gen_ctx_t gen_ctx, loop_node_t loop_node) {
  for (loop_node_t curr = DLIST_HEAD (loop_node_t, loop_node->children); curr != NULL;
       curr = DLIST_NEXT (loop_node_t, curr)) {
    if (curr->bb == NULL) {
      setup_loop_pressure (gen_ctx, curr);
    } else {
      curr->max_int_pressure = curr->bb->max_int_pressure;
      curr->max_fp_pressure = curr->bb->max_fp_pressure;
    }
    if (loop_node->max_int_pressure < curr->max_int_pressure)
      loop_node->max_int_pressure = curr->max_int_pressure;
    if (loop_node->max_fp_pressure < curr->max_fp_pressure)
      loop_node->max_fp_pressure = curr->max_fp_pressure;
  }
}